

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O2

CharSetNode * __thiscall
UnifiedRegex::CharSetInner::ClearRange
          (CharSetInner *this,ArenaAllocator *allocator,uint level,uint l,uint h)

{
  CharSetNode *pCVar1;
  code *pcVar2;
  char cVar3;
  long lVar4;
  bool bVar5;
  int iVar6;
  undefined4 *puVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  byte bVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar12;
  
  if (level == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x17b,"(level > 0)","level > 0");
    if (!bVar5) goto LAB_00cd75e4;
    *puVar7 = 0;
  }
  cVar3 = (char)level * '\x04';
  uVar10 = ~(-1 << (cVar3 + 8U & 0x1f));
  if (uVar10 < h) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x17c,"(h <= lim(level))",
                       "The range for clearing provided is invalid for this level.");
    if (!bVar5) goto LAB_00cd75e4;
    *puVar7 = 0;
  }
  if (h < l) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x17d,"(l <= h)","Can\'t clear where lower is bigger than the higher.");
    if (!bVar5) {
LAB_00cd75e4:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
  }
  else if (uVar10 == h && l == 0) {
    return (CharSetNode *)0x0;
  }
  bVar13 = cVar3 + 4;
  uVar11 = l >> (bVar13 & 0x1f) & 0xf;
  uVar12 = (ulong)uVar11;
  uVar10 = h >> (bVar13 & 0x1f) & 0xf;
  uVar9 = (ulong)(level - 1);
  uVar15 = ~(-1 << ((char)level * '\x04' + 4U & 0x1f));
  pCVar1 = this->children[uVar12];
  if (uVar11 == uVar10) {
    if (pCVar1 != (CharSetNode *)0x0) {
      iVar6 = (*pCVar1->_vptr_CharSetNode[3])
                        (pCVar1,allocator,uVar9,(ulong)(l & uVar15),(ulong)(h & uVar15));
      this->children[uVar12] = (CharSetNode *)CONCAT44(extraout_var,iVar6);
    }
  }
  else {
    if (pCVar1 != (CharSetNode *)0x0) {
      iVar6 = (*pCVar1->_vptr_CharSetNode[3])
                        (pCVar1,allocator,uVar9,(ulong)(l & uVar15),(ulong)uVar15);
      this->children[uVar12] = (CharSetNode *)CONCAT44(extraout_var_00,iVar6);
    }
    uVar14 = (ulong)uVar10;
    while (uVar12 + 1 < uVar14) {
      pCVar1 = this->children[uVar12 + 1];
      if (pCVar1 != (CharSetNode *)0x0) {
        (**pCVar1->_vptr_CharSetNode)(pCVar1,allocator);
      }
      this->children[uVar12 + 1] = (CharSetNode *)0x0;
      uVar12 = uVar12 + 1;
    }
    pCVar1 = this->children[uVar14];
    if (pCVar1 != (CharSetNode *)0x0) {
      iVar6 = (*pCVar1->_vptr_CharSetNode[3])(pCVar1,allocator,uVar9,0,(ulong)(h & uVar15));
      this->children[uVar14] = (CharSetNode *)CONCAT44(extraout_var_01,iVar6);
    }
  }
  lVar8 = 1;
  do {
    if (lVar8 == 0x11) {
      return (CharSetNode *)0x0;
    }
    lVar4 = lVar8 + -1;
    lVar8 = lVar8 + 1;
  } while (this->children[lVar4] == (CharSetNode *)0x0);
  return &this->super_CharSetNode;
}

Assistant:

CharSetNode* CharSetInner::ClearRange(ArenaAllocator* allocator, uint level, uint l, uint h)
    {
        Assert(level > 0);
        AssertMsg(h <= lim(level), "The range for clearing provided is invalid for this level.");
        AssertMsg(l <= h, "Can't clear where lower is bigger than the higher.");
        if (l == 0 && h == lim(level))
        {
            return nullptr;
        }

        uint lowerIndex = innerIdx(level, l);
        uint higherIndex = innerIdx(level--, h);
        l = l & lim(level);
        h = h & lim(level);
        if (lowerIndex == higherIndex)
        {
            if (children[lowerIndex] != nullptr)
            {
                children[lowerIndex] = children[lowerIndex]->ClearRange(allocator, level, l, h);
            }
        }
        else
        {
            if (children[lowerIndex] != nullptr)
            {
                children[lowerIndex] = children[lowerIndex]->ClearRange(allocator, level, l, lim(level));
            }

            for (uint i = lowerIndex + 1; i < higherIndex; i++)
            {
                if (children[i] != nullptr)
                {
                    children[i]->FreeSelf(allocator);
                }

                children[i] = nullptr;
            }

            if (children[higherIndex] != nullptr)
            {
                children[higherIndex] = children[higherIndex]->ClearRange(allocator, level, 0, h);
            }
        }
        for (int i = 0; i < branchingPerInnerLevel; i++)
        {
            if (children[i] != nullptr)
            {
                return this;
            }
        }

        return nullptr;
    }